

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

char * metacall_inspect(size_t *size,void *allocator)

{
  size_t *size_00;
  serial v_00;
  serial in_RSI;
  char *str;
  value v;
  serial s;
  value in_stack_00000040;
  size_t in_stack_ffffffffffffffc8;
  memory_allocator in_stack_ffffffffffffffd0;
  char *local_8;
  
  size_00 = (size_t *)loader_metadata();
  if ((size_00 == (size_t *)0x0) &&
     (size_00 = (size_t *)
                value_create_map(&in_stack_ffffffffffffffd0->iface,in_stack_ffffffffffffffc8),
     size_00 == (size_t *)0x0)) {
    log_write_impl_va("metacall",0x8f9,"metacall_inspect",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,"Invalid MetaCall inspect map creation");
    local_8 = (char *)0x0;
  }
  else {
    metacall_serial();
    v_00 = serial_create((char *)0x13a0e1);
    local_8 = serial_serialize(in_RSI,v_00,size_00,in_stack_ffffffffffffffd0);
    value_type_destroy(in_stack_00000040);
  }
  return local_8;
}

Assistant:

char *metacall_inspect(size_t *size, void *allocator)
{
	serial s;

	value v = loader_metadata();

	char *str;

	if (v == NULL)
	{
		v = value_create_map(NULL, 0);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid MetaCall inspect map creation");

			return NULL;
		}
	}

	s = serial_create(metacall_serial());

	str = serial_serialize(s, v, size, allocator);

	value_type_destroy(v);

	return str;
}